

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devices.cpp
# Opt level: O0

void DeviceNoSlot64k(CDevice **dev,CDevice *parent,aint ramtop)

{
  CDevice *this;
  int local_30 [2];
  int initialPages [1];
  aint ramtop_local;
  CDevice *parent_local;
  CDevice **dev_local;
  
  if (ramtop != 0) {
    WarningById(W_NO_RAMTOP,(char *)0x0,W_PASS3);
  }
  this = (CDevice *)operator_new(0x2838);
  CDevice::CDevice(this,"NOSLOT64K",parent);
  *dev = this;
  memset(local_30,0,4);
  initRegularSlotDevice(*dev,0x10000,1,0x20,local_30);
  return;
}

Assistant:

static void DeviceNoSlot64k(CDevice **dev, CDevice *parent, aint ramtop) {
	if (ramtop) WarningById(W_NO_RAMTOP);
	*dev = new CDevice("NOSLOT64K", parent);
	const int initialPages[] = { 0 };
	initRegularSlotDevice(*dev, 0x10000, 1, 32, initialPages);	// 32*64kiB = 2MiB
}